

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O0

XrGeneratedDispatchTableCore * RuntimeInterface::GetDispatchTable(XrInstance instance)

{
  bool bVar1;
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar2;
  pointer pRVar3;
  pointer ppVar4;
  _Node_iterator_base<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_false>
  local_40 [3];
  _Node_iterator_base<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_false>
  local_28;
  iterator it;
  lock_guard<std::mutex> mlock;
  XrGeneratedDispatchTableCore *table;
  XrInstance instance_local;
  
  mlock._M_device = (mutex_type *)0x0;
  table = (XrGeneratedDispatchTableCore *)instance;
  puVar2 = GetInstance();
  pRVar3 = std::unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_>::operator->
                     (puVar2);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&it,&pRVar3->_dispatch_table_mutex);
  puVar2 = GetInstance();
  pRVar3 = std::unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_>::operator->
                     (puVar2);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<XrInstance_T_*,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>_>_>
       ::find(&pRVar3->_dispatch_table_map,(key_type *)&table);
  puVar2 = GetInstance();
  pRVar3 = std::unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_>::operator->
                     (puVar2);
  local_40[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<XrInstance_T_*,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>_>_>
       ::end(&pRVar3->_dispatch_table_map);
  bVar1 = std::__detail::operator!=(&local_28,local_40);
  if (bVar1) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_false,_false>
                           *)&local_28);
    mlock._M_device =
         (mutex_type *)
         std::
         unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
         ::get(&ppVar4->second);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return (XrGeneratedDispatchTableCore *)mlock._M_device;
}

Assistant:

const XrGeneratedDispatchTableCore* RuntimeInterface::GetDispatchTable(XrInstance instance) {
    XrGeneratedDispatchTableCore* table = nullptr;
    std::lock_guard<std::mutex> mlock(GetInstance()->_dispatch_table_mutex);
    auto it = GetInstance()->_dispatch_table_map.find(instance);
    if (it != GetInstance()->_dispatch_table_map.end()) {
        table = it->second.get();
    }
    return table;
}